

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sign_extension.c
# Opt level: O3

uint64_t sign_extend_64(uint64_t v,int old,int new)

{
  uint uVar1;
  ulong uVar2;
  uint64_t extraout_RAX;
  int extraout_EDX;
  
  uVar2 = (ulong)(uint)old;
  if (old <= new) {
    uVar2 = (long)(1 << ((char)old - 1U & 0x1f)) & v;
    return (v ^ uVar2) - uVar2;
  }
  sign_extend_64_cold_1();
  if ((int)uVar2 <= extraout_EDX) {
    uVar1 = 1 << ((char)uVar2 - 1U & 0x1f) & (uint)v;
    return (ulong)(((uint)v ^ uVar1) - uVar1);
  }
  sign_extend_word_cold_1();
  if (gba_log_verbosity != 0) {
    printf("\x1b[0;33m[WARN]  adjusted pc: 0x%08X: SWI: 0x%X - %s\n\x1b[0;m",
           (ulong)((((arm7tdmi_t *)v)->pc + (((((arm7tdmi_t *)v)->cpsr).raw & 0x20) >> 3)) - 8),
           uVar2 & 0xff,SWI_NAMES_rel + *(int *)(SWI_NAMES_rel + (uVar2 & 0xff) * 4));
  }
  uVar1 = (((arm7tdmi_t *)v)->cpsr).raw;
  (((arm7tdmi_t *)v)->cpsr).raw = uVar1 & 0xffffffe0 | 0x13;
  set_spsr((arm7tdmi_t *)v,uVar1);
  ((arm7tdmi_t *)v)->lr_svc =
       (((arm7tdmi_t *)v)->pc + (((((arm7tdmi_t *)v)->cpsr).raw & 0x20) >> 4)) - 4;
  (((arm7tdmi_t *)v)->cpsr).raw = (((arm7tdmi_t *)v)->cpsr).raw & 0xffffff5f | 0x80;
  set_pc((arm7tdmi_t *)v,8);
  return extraout_RAX;
}

Assistant:

uint64_t sign_extend_64(uint64_t v, int old, int new) {
    unimplemented(new < old, "Can't downsize signed values with this function!")

    uint64_t mask = v & (1 << (old - 1));
    bool s = mask > 0;
    if (s) {
        return (v ^ mask) - mask;
    }
    else {
        return v; // No sign bit set, don't need to sign extend
    }
}